

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

int multissl_setup(Curl_ssl *backend)

{
  int iVar1;
  char *first;
  Curl_ssl *pCVar2;
  Curl_ssl **ppCVar3;
  
  if (Curl_ssl == &Curl_ssl_multi) {
    if (backend != (Curl_ssl *)0x0) {
      Curl_ssl = backend;
      return 0;
    }
    if (available_backends[0] != (Curl_ssl *)0x0) {
      first = curl_getenv("CURL_SSL_BACKEND");
      pCVar2 = available_backends[0];
      if (available_backends[0] != (Curl_ssl *)0x0 && first != (char *)0x0) {
        iVar1 = curl_strequal(first,(available_backends[0]->info).name);
        ppCVar3 = available_backends;
        while (iVar1 == 0) {
          pCVar2 = available_backends[0];
          if (ppCVar3[1] == (Curl_ssl *)0x0) goto LAB_0016bde5;
          iVar1 = curl_strequal(first,(ppCVar3[1]->info).name);
          ppCVar3 = ppCVar3 + 1;
        }
        pCVar2 = *ppCVar3;
      }
LAB_0016bde5:
      Curl_ssl = pCVar2;
      (*Curl_cfree)(first);
      return 0;
    }
  }
  return 1;
}

Assistant:

static int multissl_setup(const struct Curl_ssl *backend)
{
  const char *env;
  char *env_tmp;

  if(Curl_ssl != &Curl_ssl_multi)
    return 1;

  if(backend) {
    Curl_ssl = backend;
    return 0;
  }

  if(!available_backends[0])
    return 1;

  env = env_tmp = curl_getenv("CURL_SSL_BACKEND");
#ifdef CURL_DEFAULT_SSL_BACKEND
  if(!env)
    env = CURL_DEFAULT_SSL_BACKEND;
#endif
  if(env) {
    int i;
    for(i = 0; available_backends[i]; i++) {
      if(strcasecompare(env, available_backends[i]->info.name)) {
        Curl_ssl = available_backends[i];
        free(env_tmp);
        return 0;
      }
    }
  }

  /* Fall back to first available backend */
  Curl_ssl = available_backends[0];
  free(env_tmp);
  return 0;
}